

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSatOld.c
# Opt level: O0

int Cbs0_VarFaninFanoutMax(Cbs0_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  int b;
  Gia_Obj_t *pGVar3;
  int Count1;
  int Count0;
  Gia_Obj_t *pObj_local;
  Cbs0_Man_t *p_local;
  
  iVar2 = Gia_IsComplement(pObj);
  if (iVar2 != 0) {
    __assert_fail("!Gia_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                  ,0x14b,"int Cbs0_VarFaninFanoutMax(Cbs0_Man_t *, Gia_Obj_t *)");
  }
  iVar2 = Gia_ObjIsAnd(pObj);
  if (iVar2 != 0) {
    pGVar1 = p->pAig;
    pGVar3 = Gia_ObjFanin0(pObj);
    iVar2 = Gia_ObjRefNum(pGVar1,pGVar3);
    pGVar1 = p->pAig;
    pGVar3 = Gia_ObjFanin1(pObj);
    b = Gia_ObjRefNum(pGVar1,pGVar3);
    iVar2 = Abc_MaxInt(iVar2,b);
    return iVar2;
  }
  __assert_fail("Gia_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                ,0x14c,"int Cbs0_VarFaninFanoutMax(Cbs0_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline int Cbs0_VarFaninFanoutMax( Cbs0_Man_t * p, Gia_Obj_t * pObj )
{
    int Count0, Count1;
    assert( !Gia_IsComplement(pObj) );
    assert( Gia_ObjIsAnd(pObj) );
    Count0 = Gia_ObjRefNum( p->pAig, Gia_ObjFanin0(pObj) );
    Count1 = Gia_ObjRefNum( p->pAig, Gia_ObjFanin1(pObj) );
    return Abc_MaxInt( Count0, Count1 );
}